

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O3

void concept_const_suite::random_access_iterator_addition_assignment(void)

{
  ulong uVar1;
  initializer_list<int> __l;
  const_iterator a;
  vector<int,_std::allocator<int>_> data;
  circular_view<int,_18446744073709551615UL> span;
  basic_iterator<const_int> local_70;
  undefined4 local_5c;
  vector<int,_std::allocator<int>_> local_58;
  long local_40;
  circular_view<int,_18446744073709551615UL> local_38;
  
  local_38.member.data = (pointer)0x160000000b;
  local_38.member.cap = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_58,__l,(allocator_type *)&local_70);
  local_38.member.data = (pointer)0x0;
  if ((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    local_38.member.data =
         local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  }
  local_38.member.cap =
       (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  local_70.current = 0;
  local_70.parent = &local_38;
  local_38.member.size = local_38.member.cap;
  local_38.member.next = local_38.member.cap;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator+=
            (&local_70,2);
  uVar1 = local_38.member.cap * 2;
  if ((uVar1 & local_38.member.cap * 2 - 1) == 0) {
    uVar1 = uVar1 - 1 & local_38.member.next - local_38.member.size;
  }
  else {
    uVar1 = (local_38.member.next - local_38.member.size) % uVar1;
  }
  if (local_70.parent != (circular_view<int,_18446744073709551615UL> *)0x0) {
    local_40 = local_70.current - uVar1;
    local_5c = 2;
    boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
              ("std::distance(span.begin(), a)","2",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
               ,0x1d9,"void concept_const_suite::random_access_iterator_addition_assignment()",
               &local_40,&local_5c);
    if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  __assert_fail("parent",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/include/vista/detail/circular_view.ipp"
                ,0x398,
                "difference_type vista::circular_view<int>::basic_iterator<const int>::operator-(const iterator_type &) const [T = int, Extent = 18446744073709551615, U = const int]"
               );
}

Assistant:

void random_access_iterator_addition_assignment()
{
    // r += n
    std::vector<int> data = { 11, 22, 33, 44 };
    const circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::const_iterator a = span.begin();
    a += 2;
    BOOST_TEST_EQ(std::distance(span.begin(), a), 2);
}